

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v6::internal::
    parse_nonnegative_int<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>&>
              (wchar_t **begin,wchar_t *end,
              id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
              *eh)

{
  uint uVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  
  wVar2 = **begin;
  pwVar3 = *begin + 1;
  if (wVar2 == L'0') {
    *begin = pwVar3;
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      pwVar4 = pwVar3;
      if (0xccccccc < uVar1) {
        *begin = pwVar4 + -1;
        goto LAB_001ada2e;
      }
      uVar1 = (wVar2 + uVar1 * 10) - 0x30;
      if (pwVar4 == end) break;
      wVar2 = *pwVar4;
      pwVar3 = pwVar4 + 1;
    } while ((uint)(wVar2 + L'\xffffffd0') < 10);
    *begin = pwVar4;
    if ((int)uVar1 < 0) {
LAB_001ada2e:
      error_handler::on_error((error_handler *)begin,"number is too big");
    }
  }
  return uVar1;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}